

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O1

void __thiscall QtMWidgets::ProgressBar::reset(ProgressBar *this)

{
  ProgressBarPrivate *pPVar1;
  
  pPVar1 = (this->d).d;
  pPVar1->value = pPVar1->minimum + -1;
  pPVar1->animate = true;
  QAbstractAnimation::start(pPVar1->animation,0);
  QWidget::repaint();
  return;
}

Assistant:

void
ProgressBar::reset()
{
	d->value = d->minimum - 1;

	if( d->minimum == INT_MIN )
		d->value = INT_MIN;

	d->animate = true;

	d->animation->start();

	repaint();
}